

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

bool is_obj_key(string *v,int *obj,int *gen)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::__cxx11::string::substr((ulong)&bStack_48,(ulong)v);
  bVar1 = std::operator!=(&bStack_48,"obj:");
  std::__cxx11::string::~string((string *)&bStack_48);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)v);
    bVar1 = is_indirect_object(&bStack_48,obj,gen);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  return bVar1;
}

Assistant:

static bool
is_obj_key(std::string const& v, int& obj, int& gen)
{
    if (v.substr(0, 4) != "obj:") {
        return false;
    }
    return is_indirect_object(v.substr(4), obj, gen);
}